

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O2

size_t wwNAF(word *naf,word *a,size_t n,size_t w)

{
  bool_t bVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  word val;
  long lVar8;
  long lVar9;
  ulong local_60;
  
  uVar4 = 1L << ((byte)w & 0x3f);
  sVar2 = wwBitSize(a,n);
  wwSetZero(naf,n * 2 + 1);
  bVar1 = wwIsZero(a,n);
  if (bVar1 == 0) {
    uVar5 = uVar4 >> 1;
    uVar7 = ~(-1L << ((byte)w & 0x3f));
    if (0x3f < w) {
      uVar7 = 0xffffffffffffffff;
    }
    val = uVar7 & *a;
    lVar8 = 0;
    for (sVar6 = 0; uVar7 = w + sVar6, uVar7 < sVar2 || val != 0; sVar6 = sVar6 + 1) {
      if ((val & 1) == 0) {
        lVar9 = lVar8 + 1;
        wwShHi(naf,lVar8 + 0x40U >> 6,1);
        local_60 = val;
      }
      else {
        if ((uVar5 & val) == 0) {
          local_60 = 0;
        }
        else if (uVar7 < sVar2) {
          val = -val & uVar5 - 1 ^ uVar5;
          local_60 = uVar4;
        }
        else {
          val = val & uVar5 - 1;
          local_60 = uVar5;
        }
        lVar9 = lVar8 + w;
        wwShHi(naf,lVar8 + w + 0x3f >> 6,w);
        wwSetBits(naf,0,w,val);
      }
      val = local_60 >> 1;
      if (uVar7 < sVar2) {
        uVar3 = uVar5;
        if ((a[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) == 0) {
          uVar3 = 0;
        }
        val = val + uVar3;
      }
      lVar8 = lVar9;
    }
  }
  else {
    sVar6 = 0;
  }
  return sVar6;
}

Assistant:

size_t wwNAF(word naf[], const word a[], size_t n, size_t w)
{
	const word next_bit = WORD_BIT_POS(w);
	const word hi_bit = next_bit >> 1;
	const word mask = hi_bit - 1;
	register word window;
	register word digit;
	register size_t naf_len = 0;
	register size_t naf_size = 0;
	register size_t a_len = wwBitSize(a, n);
	size_t i;
	// pre
	ASSERT(wwIsDisjoint2(a, n, naf, 2 * n + 1));
	ASSERT(2 <= w && w < B_PER_W);
	// naf <- 0
	wwSetZero(naf, 2 * n + 1);
	// a == 0?
	if (wwIsZero(a, n))
		return 0;
	// window <- a mod 2^w
	window = wwGetBits(a, 0, w);
	// расчет NAF
	for (i = w; window || i < a_len; ++i)
	{
		// ненулевой символ?
		if (window & 1)
		{
			// кодирование отрицательного символа
			if (window & hi_bit)
			{
				// модифицировать отрицательный символ суффикса NAF...
				if (i >= a_len)
					// ...сделать его положительным
					digit = window & mask,
					// window <- window - digit
					window = hi_bit;
				else
					// digit <- |window|
					digit = (0 - window) & mask,
					// digit <- 1||digit
					digit ^= hi_bit,
					// window <- window - digit
					window = next_bit;
			}
			else
				// кодирование положительного символа
				digit = window,
				// window <- window - digit
				window = 0;
			// запись ненулевого символа
			wwShHi(naf, W_OF_B(naf_len + w), w);
			wwSetBits(naf, 0, w, digit);
			naf_len += w;
		}
		else
			// кодирование нулевого символа
			wwShHi(naf, W_OF_B(++naf_len), 1);
		// увеличить размер naf
		++naf_size;
		// сдвиг окна
		window >>= 1;
		if (i < a_len)
			window += hi_bit * wwTestBit(a, i);
	}
	digit = window = 0;
	naf_len = a_len = 0;
	return naf_size;
}